

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# leb128.cc
# Opt level: O0

void wabt::WriteS64Leb128(Stream *stream,int64_t value,char *desc)

{
  byte bVar1;
  uint8_t byte_1;
  size_t sStack_38;
  uint8_t byte;
  Offset length;
  uint8_t data [10];
  char *desc_local;
  int64_t value_local;
  Stream *stream_local;
  
  sStack_38 = 0;
  data._2_8_ = desc;
  desc_local = (char *)value;
  if (value < 0) {
    while( true ) {
      bVar1 = (byte)desc_local & 0x7f;
      if (((char *)((long)desc_local >> 7) == (char *)0xffffffffffffffff) &&
         (((ulong)desc_local & 0x40) != 0)) break;
      *(byte *)((long)&length + sStack_38 + 6) = bVar1 | 0x80;
      sStack_38 = sStack_38 + 1;
      desc_local = (char *)((long)desc_local >> 7);
    }
    *(byte *)((long)&length + sStack_38 + 6) = bVar1;
  }
  else {
    while( true ) {
      bVar1 = (byte)desc_local & 0x7f;
      if (((char *)((long)desc_local >> 7) == (char *)0x0) && (((ulong)desc_local & 0x40) == 0))
      break;
      *(byte *)((long)&length + sStack_38 + 6) = bVar1 | 0x80;
      sStack_38 = sStack_38 + 1;
      desc_local = (char *)((long)desc_local >> 7);
    }
    *(byte *)((long)&length + sStack_38 + 6) = bVar1;
  }
  sStack_38 = sStack_38 + 1;
  Stream::WriteData(stream,(void *)((long)&length + 6),sStack_38,(char *)data._2_8_,No);
  return;
}

Assistant:

static void WriteS64Leb128(Stream* stream, int64_t value, const char* desc) {
  uint8_t data[MAX_U64_LEB128_BYTES];
  Offset length = 0;
  if (value < 0) {
    LEB128_LOOP_UNTIL(value == -1 && (byte & 0x40));
  } else {
    LEB128_LOOP_UNTIL(value == 0 && !(byte & 0x40));
  }

  stream->WriteData(data, length, desc);
}